

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int nni_file_lock(char *path,nni_file_lockh **hp)

{
  int iVar1;
  nni_plat_flock *lk;
  
  lk = (nni_plat_flock *)nni_zalloc(4);
  if (lk == (nni_plat_flock *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = nni_plat_file_lock(path,lk);
    if (iVar1 == 0) {
      *hp = (nni_file_lockh *)lk;
      iVar1 = 0;
    }
    else {
      nni_free(lk,4);
    }
  }
  return iVar1;
}

Assistant:

int
nni_file_lock(const char *path, nni_file_lockh **hp)
{
	nni_file_lockh *h;
	int             rv;
	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	rv = nni_plat_file_lock(path, &h->lk);
	if (rv != 0) {
		NNI_FREE_STRUCT(h);
		return (rv);
	}
	*hp = h;
	return (0);
}